

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::~FabArray(FabArray<amrex::EBCellFlagFab> *this)

{
  FabArray<amrex::EBCellFlagFab> *in_RDI;
  
  ~FabArray(in_RDI);
  operator_delete(in_RDI,0x180);
  return;
}

Assistant:

FabArray<FAB>::~FabArray ()
{
    m_FA_stats.recordDelete();
    clear();
}